

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O2

NodeRef __thiscall
embree::avx::BVHNBuilderQuantizedVirtual<8>::
BVHNBuilderT<embree::avx::CreateLeafQuantized<8,_embree::TriangleM<4>_>_>::createLeaf
          (BVHNBuilderT<embree::avx::CreateLeafQuantized<8,_embree::TriangleM<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  FastAllocator *this_00;
  ThreadLocal *pTVar7;
  ThreadLocal2 *this_01;
  Scene *pSVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  anon_union_16_2_9473010e_for_vuint_impl<4>_1 aVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  ulong uVar18;
  ulong uVar19;
  char *pcVar20;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  float *pfVar25;
  ulong uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 in_ZMM0 [64];
  vuint<4> vgeomID;
  Vec3vf<4> v0;
  Vec3vf<4> v1;
  Vec3vf<4> v2;
  vuint<4> vprimID;
  
  auVar28 = in_ZMM0._0_16_;
  uVar21 = set->_begin;
  uVar18 = (set->_end - uVar21) + 3 >> 2;
  this_00 = alloc->alloc;
  pTVar7 = alloc->talloc1;
  vgeomID.field_0.v[0] = uVar18 * 0xb0;
  this_01 = pTVar7->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    v1.field_0._8_1_ = 1;
    v1.field_0._0_8_ = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    v0.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    v0.field_0._8_1_ = 1;
    auVar28 = (undefined1  [16])0x0;
    v2.field_0._0_8_ = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,(value_type *)&v2);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v0);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v1);
  }
  uVar17 = vgeomID.field_0.v[0];
  pTVar7->bytesUsed = pTVar7->bytesUsed + vgeomID.field_0.v[0];
  sVar22 = pTVar7->cur;
  uVar23 = (ulong)(-(int)sVar22 & 0xf);
  uVar19 = sVar22 + vgeomID.field_0.v[0] + uVar23;
  pTVar7->cur = uVar19;
  if (pTVar7->end < uVar19) {
    pTVar7->cur = sVar22;
    uVar19 = pTVar7->allocBlockSize;
    if ((ulong)(vgeomID.field_0.v[0] * 4) < uVar19 || vgeomID.field_0.v[0] * 4 - uVar19 == 0) {
      v0.field_0._0_8_ = uVar19;
      pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)&v0);
      pTVar7->ptr = pcVar20;
      sVar22 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
      pTVar7->bytesWasted = sVar22;
      pTVar7->end = v0.field_0._0_8_;
      pTVar7->cur = uVar17;
      if ((ulong)v0.field_0._0_8_ < (ulong)uVar17) {
        pTVar7->cur = 0;
        v0.field_0._0_8_ = pTVar7->allocBlockSize;
        pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)&v0);
        pTVar7->ptr = pcVar20;
        sVar22 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
        pTVar7->bytesWasted = sVar22;
        pTVar7->end = v0.field_0._0_8_;
        pTVar7->cur = uVar17;
        if ((ulong)v0.field_0._0_8_ < (ulong)uVar17) {
          pTVar7->cur = 0;
          pcVar20 = (char *)0x0;
          goto LAB_00c4a5a4;
        }
      }
      pTVar7->bytesWasted = sVar22;
    }
    else {
      pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)&vgeomID);
    }
  }
  else {
    pTVar7->bytesWasted = pTVar7->bytesWasted + uVar23;
    pcVar20 = pTVar7->ptr + (uVar19 - vgeomID.field_0._0_8_);
  }
LAB_00c4a5a4:
  uVar19 = 0;
  aVar12 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpcmpeqd_avx(auVar28,auVar28);
  v0.field_0._0_8_ = 0;
  uVar17 = v0.field_0._0_8_;
  for (; uVar19 != uVar18; uVar19 = uVar19 + 1) {
    uVar23 = set->_end;
    pSVar8 = ((this->createLeafFunc).bvh)->scene;
    v0.field_0.field_0.z.field_0 =
         (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
    v0.field_0._8_1_ = 0;
    v0.field_0._9_7_ = 0;
    v0.field_0.field_0.y.field_0 =
         (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
    v1.field_0.field_0.z.field_0 =
         (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
    v1.field_0.field_0.y.field_0 =
         (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
    v2.field_0.field_0.z.field_0 =
         (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
    v2.field_0._8_8_ = 0;
    v2.field_0.field_0.y.field_0 =
         (vfloat_impl<4>)(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0;
    pfVar25 = prims[uVar21].upper.field_0.m128 + 3;
    vgeomID.field_0 = aVar12;
    v0.field_0._0_8_ = uVar17;
    v1.field_0._0_8_ = uVar17;
    v1.field_0._8_1_ = v0.field_0._8_1_;
    v1.field_0._9_7_ = v0.field_0._9_7_;
    v2.field_0._0_8_ = uVar17;
    vprimID.field_0 = aVar12;
    for (uVar26 = 0; (uVar26 < 4 && (uVar21 + uVar26 < uVar23)); uVar26 = uVar26 + 1) {
      fVar4 = pfVar25[-4];
      fVar5 = *pfVar25;
      pGVar9 = (pSVar8->geometries).items[(uint)fVar4].ptr;
      lVar27 = (ulong)(uint)fVar5 *
               pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar24 = *(long *)&pGVar9->field_0x58;
      lVar10 = *(long *)&pGVar9[1].time_range.upper;
      p_Var11 = pGVar9[1].intersectionFilterN;
      auVar28 = *(undefined1 (*) [16])(lVar10 + (ulong)*(uint *)(lVar24 + lVar27) * (long)p_Var11);
      auVar2 = *(undefined1 (*) [16])
                (lVar10 + (ulong)*(uint *)(lVar24 + 4 + lVar27) * (long)p_Var11);
      auVar3 = *(undefined1 (*) [16])
                (lVar10 + (ulong)*(uint *)(lVar24 + 8 + lVar27) * (long)p_Var11);
      *(int *)((long)&v0.field_0 + uVar26 * 4) = auVar28._0_4_;
      uVar6 = vextractps_avx(auVar28,1);
      *(undefined4 *)((long)&v0.field_0 + uVar26 * 4 + 0x10) = uVar6;
      uVar6 = vextractps_avx(auVar28,2);
      *(undefined4 *)((long)&v0.field_0 + uVar26 * 4 + 0x20) = uVar6;
      *(int *)((long)&v1.field_0 + uVar26 * 4) = auVar2._0_4_;
      uVar6 = vextractps_avx(auVar2,1);
      *(undefined4 *)((long)&v1.field_0 + uVar26 * 4 + 0x10) = uVar6;
      uVar6 = vextractps_avx(auVar2,2);
      *(undefined4 *)((long)&v1.field_0 + uVar26 * 4 + 0x20) = uVar6;
      *(int *)((long)&v2.field_0 + uVar26 * 4) = auVar3._0_4_;
      uVar6 = vextractps_avx(auVar3,1);
      *(undefined4 *)((long)&v2.field_0 + uVar26 * 4 + 0x10) = uVar6;
      uVar6 = vextractps_avx(auVar3,2);
      *(undefined4 *)((long)&v2.field_0 + uVar26 * 4 + 0x20) = uVar6;
      vgeomID.field_0.i[uVar26] = (uint)fVar4;
      vprimID.field_0.i[uVar26] = (uint)fVar5;
      pfVar25 = pfVar25 + 8;
    }
    lVar24 = uVar19 * 0xb0;
    auVar28[8] = v0.field_0._8_1_;
    auVar28._0_8_ = v0.field_0._0_8_;
    auVar28._9_7_ = v0.field_0._9_7_;
    auVar2[8] = v1.field_0._8_1_;
    auVar2._0_8_ = v1.field_0._0_8_;
    auVar2._9_7_ = v1.field_0._9_7_;
    auVar2 = vsubps_avx(auVar28,auVar2);
    auVar3 = vsubps_avx((undefined1  [16])v0.field_0.field_0.y.field_0,
                        (undefined1  [16])v1.field_0.field_0.y.field_0);
    auVar13 = vsubps_avx((undefined1  [16])v0.field_0.field_0.z.field_0,
                         (undefined1  [16])v1.field_0.field_0.z.field_0);
    auVar14._8_8_ = v2.field_0._8_8_;
    auVar14._0_8_ = v2.field_0._0_8_;
    auVar14 = vsubps_avx(auVar14,auVar28);
    auVar15 = vsubps_avx((undefined1  [16])v2.field_0.field_0.y.field_0,
                         (undefined1  [16])v0.field_0.field_0.y.field_0);
    auVar16 = vsubps_avx((undefined1  [16])v2.field_0.field_0.z.field_0,
                         (undefined1  [16])v0.field_0.field_0.z.field_0);
    auVar28 = vmovntps_avx(auVar28);
    *(undefined1 (*) [16])(pcVar20 + lVar24) = auVar28;
    auVar28 = vmovntps_avx((undefined1  [16])v0.field_0.field_0.y.field_0);
    *(undefined1 (*) [16])(pcVar20 + lVar24 + 0x10) = auVar28;
    auVar28 = vmovntps_avx((undefined1  [16])v0.field_0.field_0.z.field_0);
    *(undefined1 (*) [16])(pcVar20 + lVar24 + 0x20) = auVar28;
    auVar28 = vmovntps_avx(auVar2);
    *(undefined1 (*) [16])(pcVar20 + lVar24 + 0x30) = auVar28;
    auVar28 = vmovntps_avx(auVar3);
    *(undefined1 (*) [16])(pcVar20 + lVar24 + 0x40) = auVar28;
    auVar28 = vmovntps_avx(auVar13);
    *(undefined1 (*) [16])(pcVar20 + lVar24 + 0x50) = auVar28;
    auVar28 = vmovntps_avx(auVar14);
    *(undefined1 (*) [16])(pcVar20 + lVar24 + 0x60) = auVar28;
    auVar28 = vmovntps_avx(auVar15);
    *(undefined1 (*) [16])(pcVar20 + lVar24 + 0x70) = auVar28;
    auVar28 = vmovntps_avx(auVar16);
    *(undefined1 (*) [16])(pcVar20 + lVar24 + 0x80) = auVar28;
    auVar28 = vmovntps_avx((undefined1  [16])vgeomID.field_0);
    *(undefined1 (*) [16])(pcVar20 + lVar24 + 0x90) = auVar28;
    auVar28 = vmovntps_avx((undefined1  [16])vprimID.field_0);
    *(undefined1 (*) [16])(pcVar20 + lVar24 + 0xa0) = auVar28;
    uVar21 = uVar21 + uVar26;
  }
  uVar21 = 7;
  if (uVar18 < 7) {
    uVar21 = uVar18;
  }
  return (NodeRef)(uVar21 | (ulong)pcVar20 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }